

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.h
# Opt level: O2

void slang::DiagnosticEngine::setDefaultFormatter<slang::ast::Type_const*>
               (shared_ptr<slang::DiagArgFormatter> *formatter)

{
  char *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  size_t hash;
  byte bVar5;
  ulong uVar6;
  pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *__rhs;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong pos0;
  undefined1 auVar11 [16];
  char cVar12;
  char cVar13;
  char cVar14;
  byte bVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  byte bVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  byte bVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  byte bVar27;
  try_emplace_args_t local_91;
  type_index local_90;
  size_t local_88;
  ulong local_80;
  ulong local_78;
  __shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2> *local_70;
  char local_68;
  char cStack_67;
  char cStack_66;
  byte bStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  byte bStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  byte bStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  byte bStack_59;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  locator local_48;
  
  local_90._M_target = (type_info *)&ast::Type_const*::typeinfo;
  local_70 = &formatter->super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>;
  hash = boost::unordered::detail::foa::mulx_mix::
         mix<slang::hash<std::type_index,void>,std::type_index>
                   ((hash<std::type_index,_void> *)&defaultFormatters,&local_90);
  pos0 = hash >> (defaultFormatters & 0x3f);
  lVar7 = (hash & 0xff) * 4;
  cVar12 = (&UNK_0042856c)[lVar7];
  cVar13 = (&UNK_0042856d)[lVar7];
  cVar14 = (&UNK_0042856e)[lVar7];
  bVar15 = (&UNK_0042856f)[lVar7];
  uVar10 = (uint)hash;
  uVar6 = 0;
  uVar8 = pos0;
  cVar16 = cVar12;
  cVar17 = cVar13;
  cVar18 = cVar14;
  bVar19 = bVar15;
  cVar20 = cVar12;
  cVar21 = cVar13;
  cVar22 = cVar14;
  bVar23 = bVar15;
  cVar24 = cVar12;
  cVar25 = cVar13;
  cVar26 = cVar14;
  bVar27 = bVar15;
  do {
    pcVar1 = (char *)(DAT_005bd760 + uVar8 * 0x10);
    local_58 = *pcVar1;
    cStack_57 = pcVar1[1];
    cStack_56 = pcVar1[2];
    bStack_55 = pcVar1[3];
    cStack_54 = pcVar1[4];
    cStack_53 = pcVar1[5];
    cStack_52 = pcVar1[6];
    bStack_51 = pcVar1[7];
    cStack_50 = pcVar1[8];
    cStack_4f = pcVar1[9];
    cStack_4e = pcVar1[10];
    bStack_4d = pcVar1[0xb];
    cStack_4c = pcVar1[0xc];
    cStack_4b = pcVar1[0xd];
    cStack_4a = pcVar1[0xe];
    bVar5 = pcVar1[0xf];
    auVar11[0] = -(local_58 == cVar12);
    auVar11[1] = -(cStack_57 == cVar13);
    auVar11[2] = -(cStack_56 == cVar14);
    auVar11[3] = -(bStack_55 == bVar15);
    auVar11[4] = -(cStack_54 == cVar16);
    auVar11[5] = -(cStack_53 == cVar17);
    auVar11[6] = -(cStack_52 == cVar18);
    auVar11[7] = -(bStack_51 == bVar19);
    auVar11[8] = -(cStack_50 == cVar20);
    auVar11[9] = -(cStack_4f == cVar21);
    auVar11[10] = -(cStack_4e == cVar22);
    auVar11[0xb] = -(bStack_4d == bVar23);
    auVar11[0xc] = -(cStack_4c == cVar24);
    auVar11[0xd] = -(cStack_4b == cVar25);
    auVar11[0xe] = -(cStack_4a == cVar26);
    auVar11[0xf] = -(bVar5 == bVar27);
    uVar4 = (uint)(ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe);
    bStack_49 = bVar5;
    if (uVar4 != 0) {
      lVar9 = DAT_005bd760 + uVar8 * 0x10;
      lVar7 = DAT_005bd768 + uVar8 * 0x168;
      local_88 = hash;
      local_80 = uVar8;
      local_78 = uVar6;
      local_68 = cVar12;
      cStack_67 = cVar13;
      cStack_66 = cVar14;
      bStack_65 = bVar15;
      cStack_64 = cVar16;
      cStack_63 = cVar17;
      cStack_62 = cVar18;
      bStack_61 = bVar19;
      cStack_60 = cVar20;
      cStack_5f = cVar21;
      cStack_5e = cVar22;
      bStack_5d = bVar23;
      cStack_5c = cVar24;
      cStack_5b = cVar25;
      cStack_5a = cVar26;
      bStack_59 = bVar27;
      do {
        uVar2 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        __rhs = (pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *)
                ((ulong)uVar2 * 0x18 + lVar7);
        bVar3 = std::type_index::operator==(&local_90,(type_index *)__rhs);
        if (bVar3) goto LAB_002ba76c;
        uVar4 = uVar4 - 1 & uVar4;
      } while (uVar4 != 0);
      bVar5 = *(byte *)(lVar9 + 0xf);
      hash = local_88;
      uVar6 = local_78;
      uVar8 = local_80;
      cVar12 = local_68;
      cVar13 = cStack_67;
      cVar14 = cStack_66;
      bVar15 = bStack_65;
      cVar16 = cStack_64;
      cVar17 = cStack_63;
      cVar18 = cStack_62;
      bVar19 = bStack_61;
      cVar20 = cStack_60;
      cVar21 = cStack_5f;
      cVar22 = cStack_5e;
      bVar23 = bStack_5d;
      cVar24 = cStack_5c;
      cVar25 = cStack_5b;
      cVar26 = cStack_5a;
      bVar27 = bStack_59;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar10 & 7] & bVar5) == 0) break;
    lVar7 = uVar8 + uVar6;
    uVar6 = uVar6 + 1;
    uVar8 = lVar7 + 1U & DAT_005bd758;
  } while (uVar6 <= DAT_005bd758);
  if (DAT_005bd778 < DAT_005bd770) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
    ::unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
                *)&defaultFormatters,pos0,hash,&local_91,&local_90);
    __rhs = local_48.p;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
                *)&defaultFormatters,hash,&local_91,&local_90);
    __rhs = local_48.p;
  }
LAB_002ba76c:
  std::__shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__rhs->second).
              super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>,local_70);
  return;
}

Assistant:

static void setDefaultFormatter(std::shared_ptr<DiagArgFormatter> formatter) {
        defaultFormatters[SLANG_TYPEOF(ForType)] = std::move(formatter);
    }